

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O1

void __thiscall
gimage::JPEGImageIO::loadHeader(JPEGImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  FILE *__stream;
  IOException *pIVar2;
  long *plVar3;
  size_type *psVar4;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  allocator local_3c9;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [168];
  undefined8 local_2c0 [6];
  uint local_290;
  uint local_28c;
  int local_288;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 == '\0') {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3a8,name,&local_3c9);
    std::operator+(&local_388,"Can only load JPG image (",&local_3a8);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_388);
    local_3c8._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_3c8._M_dataplus._M_p == psVar4) {
      local_3c8.field_2._M_allocated_capacity = *psVar4;
      local_3c8.field_2._8_8_ = plVar3[3];
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    }
    else {
      local_3c8.field_2._M_allocated_capacity = *psVar4;
    }
    local_3c8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    gutil::IOException::IOException(pIVar2,&local_3c8);
    __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    local_2c0[0] = jpeg_std_error(local_368);
    jpeg_CreateDecompress(local_2c0,0x50,0x290);
    jpeg_stdio_src(local_2c0,__stream);
    jpeg_read_header(local_2c0,1);
    *width = (ulong)local_290;
    *height = (ulong)local_28c;
    *depth = local_288;
    jpeg_destroy_decompress(local_2c0);
    fclose(__stream);
    return;
  }
  pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_3a8,name,&local_3c9);
  std::operator+(&local_388,"Cannot open file for reading (",&local_3a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_388);
  local_3c8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_3c8._M_dataplus._M_p == psVar4) {
    local_3c8.field_2._M_allocated_capacity = *psVar4;
    local_3c8.field_2._8_8_ = plVar3[3];
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  }
  else {
    local_3c8.field_2._M_allocated_capacity = *psVar4;
  }
  local_3c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  gutil::IOException::IOException(pIVar2,&local_3c8);
  __cxa_throw(pIVar2,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void JPEGImageIO::loadHeader(const char *name, long &width, long &height,
                             int &depth) const
{
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  width=static_cast<long>(cinfo.image_width);
  height=static_cast<long>(cinfo.image_height);
  depth=cinfo.num_components;

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
}